

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_thread_create(uv_thread_t *tid,_func_void_void_ptr *entry,void *arg)

{
  int iVar1;
  undefined8 *__arg;
  undefined8 in_RDX;
  undefined8 in_RSI;
  pthread_t *in_RDI;
  int err;
  thread_ctx *ctx;
  int local_4;
  
  __arg = (undefined8 *)malloc(0x10);
  if (__arg == (undefined8 *)0x0) {
    local_4 = -0xc;
  }
  else {
    *__arg = in_RSI;
    __arg[1] = in_RDX;
    iVar1 = pthread_create(in_RDI,(pthread_attr_t *)0x0,uv__thread_start,__arg);
    if (iVar1 != 0) {
      free(__arg);
    }
    local_4 = 0;
    if (iVar1 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int uv_thread_create(uv_thread_t *tid, void (*entry)(void *arg), void *arg) {
  struct thread_ctx* ctx;
  int err;

  ctx = malloc(sizeof(*ctx));
  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->entry = entry;
  ctx->arg = arg;

#ifdef _WIN32
  *tid = (HANDLE) _beginthreadex(NULL, 0, uv__thread_start, ctx, 0, NULL);
  err = *tid ? 0 : errno;
#else
  err = pthread_create(tid, NULL, uv__thread_start, ctx);
#endif

  if (err)
    free(ctx);

  return err ? -1 : 0;
}